

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCGSolver.cpp
# Opt level: O3

int __thiscall
amrex::MLCGSolver::solve_cg(MLCGSolver *this,MultiFab *sol,MultiFab *rhs,Real eps_rel,Real eps_abs)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  IntVect *nghost;
  int ncomp;
  FabFactory<amrex::FArrayBox> *factory;
  char cVar1;
  bool bVar2;
  int iVar3;
  char *msg;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double dVar5;
  char local_991;
  char *local_978;
  undefined1 local_938 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_928 [15];
  MultiFab r;
  MultiFab sorig;
  MultiFab p;
  MultiFab q;
  MultiFab z;
  
  ncomp = (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  bxs = &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  factory = (sol->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  sorig.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       *(_func_int ***)(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
  sorig.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2];
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&p,bxs,dm,ncomp,(IntVect *)&sorig,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&p.super_FabArray<amrex::FArrayBox>,0.0,0,
             p.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &p.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&sorig,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&r,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&z,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  local_938._0_4_ = 1;
  local_938._4_4_ = 0;
  local_938._8_8_ = (Arena *)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_928[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&q,bxs,dm,ncomp,this->nghost,(MFInfo *)local_938,factory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_928);
  MultiFab::Copy(&sorig,sol,0,0,ncomp,this->nghost);
  (*this->Lp->_vptr_MLLinOp[0x11])
            (this->Lp,(ulong)(uint)this->amrlev,(ulong)(uint)this->mglev,&r,sol,rhs,0,0);
  nghost = &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&sol->super_FabArray<amrex::FArrayBox>,0.0,0,
             (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost);
  local_938._0_4_ = 0;
  local_938._4_4_ = 0;
  local_938._8_8_ = local_938._8_8_ & 0xffffffff00000000;
  msg = (char *)MultiFab::norm0(&r,0,r.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
                                (IntVect *)local_938,true,false);
  if (0 < this->verbose) {
    local_938._8_8_ = OutStream();
    local_938._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_938._0_4_ = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_928);
    *(undefined8 *)
     ((long)&avStack_928[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     avStack_928[0].
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((long)&((ArenaInfo *)(local_938._8_8_ + 8))->release_threshold +
          (long)(*(_func_int ***)local_938._8_8_)[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)avStack_928,"MLCGSolver_CG: Initial error (error0) :        ",0x2f);
    std::ostream::_M_insert<double>((double)msg);
    local_991 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928,&local_991,1);
    Print::~Print((Print *)local_938);
  }
  this->iter = 1;
  if ((((double)msg == 0.0) && (!NAN((double)msg))) || ((double)msg < eps_abs)) {
    iVar3 = 0;
    if (0 < this->verbose) {
      local_938._8_8_ = OutStream();
      local_938._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      local_938._0_4_ = *(int *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_928);
      *(undefined8 *)
       ((long)&avStack_928[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       avStack_928[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_938._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_938._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)avStack_928,"MLCGSolver_CG: niter = 0,",0x19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928,", rnorm = ",10);
      std::ostream::_M_insert<double>((double)msg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928,", eps_abs = ",0xc);
      std::ostream::_M_insert<double>(eps_abs);
      cVar1 = (char)(ostringstream *)avStack_928;
      std::ios::widen((char)avStack_928[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      Print::~Print((Print *)local_938);
      iVar3 = 0;
    }
  }
  else {
    bVar2 = true;
    local_978 = msg;
    if (0 < this->maxiter) {
      dVar4 = (double)msg * eps_rel;
      dVar5 = 0.0;
      do {
        MultiFab::Copy(&z,&r,0,0,ncomp,this->nghost);
        (*this->Lp->_vptr_MLLinOp[0x20])
                  (this->Lp,(ulong)(uint)this->amrlev,(ulong)(uint)this->mglev);
        if ((extraout_XMM0_Qa == 0.0) && (!NAN(extraout_XMM0_Qa))) {
LAB_00555232:
          bVar2 = false;
          goto LAB_00555235;
        }
        if (this->iter == 1) {
          MultiFab::Copy(&p,&z,0,0,ncomp,this->nghost);
        }
        else {
          MultiFab::LinComb(&p,1.0,&z,0,extraout_XMM0_Qa / dVar5,&p,0,0,
                            p.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
                            this->nghost);
        }
        (*this->Lp->_vptr_MLLinOp[0xd])
                  (this->Lp,(ulong)(uint)this->amrlev,(ulong)(uint)this->mglev,&q,&p,0,1,0);
        (*this->Lp->_vptr_MLLinOp[0x20])
                  (this->Lp,(ulong)(uint)this->amrlev,(ulong)(uint)this->mglev,&p);
        if ((extraout_XMM0_Qa_00 == 0.0) && (!NAN(extraout_XMM0_Qa_00))) goto LAB_00555232;
        dVar5 = extraout_XMM0_Qa / extraout_XMM0_Qa_00;
        if (2 < this->verbose) {
          local_938._8_8_ = OutStream();
          local_938._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
          local_938._0_4_ = *(int *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_928);
          *(undefined8 *)
           ((long)&avStack_928[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           avStack_928[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&((ArenaInfo *)(local_938._8_8_ + 8))->release_threshold +
                (long)(*(_func_int ***)local_938._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)avStack_928,"MLCGSolver_cg:",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928," iter ",6);
          std::ostream::operator<<((ostringstream *)avStack_928,this->iter);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928," rho ",5);
          std::ostream::_M_insert<double>(extraout_XMM0_Qa);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928," alpha ",7);
          std::ostream::_M_insert<double>(dVar5);
          local_991 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928,&local_991,1);
          Print::~Print((Print *)local_938);
        }
        MultiFab::LinComb(sol,1.0,sol,0,dVar5,&p,0,0,
                          (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
                          this->nghost);
        MultiFab::LinComb(&r,1.0,&r,0,-dVar5,&q,0,0,
                          r.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,this->nghost)
        ;
        local_938._0_4_ = 0;
        local_938._4_4_ = 0;
        local_938._8_8_ = local_938._8_8_ & 0xffffffff00000000;
        local_978 = (char *)MultiFab::norm0(&r,0,r.super_FabArray<amrex::FArrayBox>.
                                                 super_FabArrayBase.n_comp,(IntVect *)local_938,true
                                            ,false);
        if (2 < this->verbose) {
          local_938._8_8_ = OutStream();
          local_938._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
          local_938._0_4_ = *(int *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_928);
          *(undefined8 *)
           ((long)&avStack_928[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           avStack_928[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&((ArenaInfo *)(local_938._8_8_ + 8))->release_threshold +
                (long)(*(_func_int ***)local_938._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)avStack_928,"MLCGSolver_cg:       Iteration",0x1e);
          *(undefined8 *)
           ((long)&avStack_928[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage +
           avStack_928[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) = 4;
          std::ostream::operator<<((ostringstream *)avStack_928,this->iter);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)avStack_928," rel. err. ",0xb);
          std::ostream::_M_insert<double>((double)local_978 / (double)msg);
          local_991 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928,&local_991,1);
          Print::~Print((Print *)local_938);
        }
      } while (((dVar4 <= (double)local_978) && (eps_abs <= (double)local_978)) &&
              (iVar3 = this->iter, this->iter = iVar3 + 1, dVar5 = extraout_XMM0_Qa,
              iVar3 < this->maxiter));
      bVar2 = true;
    }
LAB_00555235:
    if (0 < this->verbose) {
      local_938._8_8_ = OutStream();
      local_938._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      local_938._0_4_ = *(int *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_928);
      *(undefined8 *)
       ((long)&avStack_928[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       avStack_928[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_938._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_938._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)avStack_928,"MLCGSolver_cg: Final Iteration",0x1e);
      *(undefined8 *)
       ((long)&avStack_928[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage +
       avStack_928[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) = 4;
      std::ostream::operator<<((ostringstream *)avStack_928,this->iter);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928," rel. err. ",0xb);
      std::ostream::_M_insert<double>((double)local_978 / (double)msg);
      local_991 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_928,&local_991,1);
      Print::~Print((Print *)local_938);
    }
    iVar3 = 1;
    if (bVar2) {
      iVar3 = 0;
      if (((eps_rel * (double)msg < (double)local_978) && (iVar3 = 0, eps_abs < (double)local_978))
         && ((iVar3 = 8, 0 < this->verbose && (*(int *)(ParallelContext::frames + 0xc) == 0)))) {
        Warning_host(msg);
      }
      if ((double)local_978 < (double)msg) {
        MultiFab::plus(sol,&sorig,0,ncomp,this->nghost);
        goto LAB_005553c7;
      }
    }
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&sol->super_FabArray<amrex::FArrayBox>,0.0,0,
               (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost);
    MultiFab::plus(sol,&sorig,0,ncomp,this->nghost);
  }
LAB_005553c7:
  MultiFab::~MultiFab(&q);
  MultiFab::~MultiFab(&z);
  MultiFab::~MultiFab(&r);
  MultiFab::~MultiFab(&sorig);
  MultiFab::~MultiFab(&p);
  return iVar3;
}

Assistant:

int
MLCGSolver::solve_cg (MultiFab&       sol,
                      const MultiFab& rhs,
                      Real            eps_rel,
                      Real            eps_abs)
{
    BL_PROFILE("MLCGSolver::cg");

    const int ncomp = sol.nComp();

    const BoxArray& ba = sol.boxArray();
    const DistributionMapping& dm = sol.DistributionMap();
    const auto& factory = sol.Factory();

    MultiFab p(ba, dm, ncomp, sol.nGrowVect(), MFInfo(), factory);
    p.setVal(0.0);

    MultiFab sorig(ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab r    (ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab z    (ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab q    (ba, dm, ncomp, nghost, MFInfo(), factory);

    MultiFab::Copy(sorig,sol,0,0,ncomp,nghost);

    Lp.correctionResidual(amrlev, mglev, r, sol, rhs, MLLinOp::BCMode::Homogeneous);

    sol.setVal(0);

    Real       rnorm    = norm_inf(r);
    const Real rnorm0   = rnorm;

    if ( verbose > 0 )
    {
        amrex::Print() << "MLCGSolver_CG: Initial error (error0) :        " << rnorm0 << '\n';
    }

    Real rho_1 = 0;
    int  ret = 0;
    iter = 1;

    if ( rnorm0 == 0 || rnorm0 < eps_abs )
    {
        if ( verbose > 0 ) {
            amrex::Print() << "MLCGSolver_CG: niter = 0,"
                           << ", rnorm = " << rnorm
                           << ", eps_abs = " << eps_abs << std::endl;
        }
        return ret;
    }

    for (; iter <= maxiter; ++iter)
    {
        MultiFab::Copy(z,r,0,0,ncomp,nghost);

        Real rho = dotxy(z,r);

        if ( rho == 0 )
        {
            ret = 1; break;
        }
        if (iter == 1)
        {
            MultiFab::Copy(p,z,0,0,ncomp,nghost);
        }
        else
        {
            Real beta = rho/rho_1;
            sxay(p, z, beta, p, nghost);
        }
        Lp.apply(amrlev, mglev, q, p, MLLinOp::BCMode::Homogeneous, MLLinOp::StateMode::Correction);

        Real alpha;
        Real pw = dotxy(p,q);
        if ( pw != Real(0.0))
        {
            alpha = rho/pw;
        }
        else
        {
            ret = 1; break;
        }

        if ( verbose > 2 )
        {
            amrex::Print() << "MLCGSolver_cg:"
                           << " iter " << iter
                           << " rho " << rho
                           << " alpha " << alpha << '\n';
        }
        sxay(sol, sol, alpha, p, nghost);
        sxay(  r,   r,-alpha, q, nghost);
        rnorm = norm_inf(r);

        if ( verbose > 2 )
        {
            amrex::Print() << "MLCGSolver_cg:       Iteration"
                           << std::setw(4) << iter
                           << " rel. err. "
                           << rnorm/(rnorm0) << '\n';
        }

        if ( rnorm < eps_rel*rnorm0 || rnorm < eps_abs ) break;

        rho_1 = rho;
    }

    if ( verbose > 0 )
    {
        amrex::Print() << "MLCGSolver_cg: Final Iteration"
                       << std::setw(4) << iter
                       << " rel. err. "
                       << rnorm/(rnorm0) << '\n';
    }

    if ( ret == 0 &&  rnorm > eps_rel*rnorm0 && rnorm > eps_abs )
    {
        if ( verbose > 0 && ParallelDescriptor::IOProcessor() )
            amrex::Warning("MLCGSolver_cg: failed to converge!");
        ret = 8;
    }

    if ( ( ret == 0 || ret == 8 ) && (rnorm < rnorm0) )
    {
        sol.plus(sorig, 0, ncomp, nghost);
    }
    else
    {
        sol.setVal(0);
        sol.plus(sorig, 0, ncomp, nghost);
    }

    return ret;
}